

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

MatrixXd *
Util::GetGravJac(MatrixXd *__return_storage_ptr__,Vector3d *pos,Vector3d *vel,double Rearth,
                double wEarth,double mu,double J2,double J3,double drag_coeff)

{
  double *pdVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dd;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  ulong in_XMM4_Qb;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dStack_240;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_22b;
  double local_228;
  double dStack_220;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double local_1a8;
  double dStack_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  double local_168;
  undefined8 uStack_160;
  double local_150;
  double local_148;
  double dStack_140;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  ulong uStack_100;
  double local_f8;
  ulong uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  double local_98;
  undefined8 uStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_48;
  
  local_218 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2];
  uStack_210 = 0;
  local_208 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  dStack_200 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
               array[1];
  local_88 = (vel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[0];
  dStack_80 = (vel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1];
  local_68 = (vel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
  uStack_60 = 0;
  local_48.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)0x6;
  local_48.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = 6;
  local_48.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = 0;
  local_78 = wEarth;
  local_58 = drag_coeff;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_48);
  local_48.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_outerStride
       = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_rows;
  local_48.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_data +
       local_48.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       m_outerStride * 3;
  local_48.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = 3;
  local_48.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = 3;
  local_48.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startRow.
  m_value = 0;
  local_48.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startCol.
  m_value = 3;
  local_48.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (&local_48,&local_22b);
  uVar4 = uStack_210;
  dVar6 = local_218 * local_218;
  dVar16 = local_208 * local_208;
  dVar13 = dStack_200 * dStack_200;
  uVar5 = (undefined4)((ulong)dVar13 >> 0x20);
  auVar3._8_4_ = SUB84(dVar13,0);
  auVar3._0_8_ = dVar16;
  auVar3._12_4_ = uVar5;
  local_228 = dVar16 * 3.0;
  dStack_220 = dVar13 * 3.0;
  local_178._8_4_ = SUB84(dVar13,0);
  local_178._0_8_ = dVar16 + dVar13;
  local_178._12_4_ = uVar5;
  dVar10 = dVar16 + dVar13 + dVar6;
  dVar12 = pow(dVar10,1.5);
  dVar7 = pow(dVar10,2.5);
  dVar7 = 1.0 / dVar7;
  local_138 = pow(dVar10,3.5);
  local_138 = 1.0 / local_138;
  uStack_130 = 0;
  local_168 = pow(dVar10,5.5);
  local_168 = 1.0 / local_168;
  uStack_160 = 0;
  uVar5 = local_178._12_4_;
  local_178._8_4_ = local_178._8_4_;
  local_178._0_8_ = local_178._0_8_ + dVar6 * -4.0;
  local_178._12_4_ = uVar5;
  local_1b8 = pow(1.0 / dVar12,3.0);
  local_198._8_4_ = extraout_XMM0_Dc;
  local_198._0_8_ = local_1b8;
  local_198._12_4_ = extraout_XMM0_Dd;
  local_188._8_8_ = dStack_220;
  local_188._0_8_ = dStack_220;
  local_b8 = (local_228 + dStack_220) - (dVar6 + dVar6);
  dStack_b0 = dStack_220;
  local_148 = local_228 + dStack_220 + dVar6 * -4.0;
  local_98 = dVar7 * mu;
  uStack_90 = 0;
  dVar8 = J3 * mu;
  local_1b8 = dVar8 * local_1b8;
  dStack_140 = dStack_220;
  local_a8._8_4_ = SUB84(dStack_220,0);
  local_a8._0_8_ = local_148 * local_1b8;
  local_a8._12_4_ = (int)((ulong)dStack_220 >> 0x20);
  local_1c8 = dStack_200;
  dStack_1c0 = dStack_200;
  dVar11 = local_208 * local_1b8 * dStack_200 * local_218;
  dStack_240 = auVar3._8_8_;
  local_1e8._8_8_ = dStack_200;
  local_1e8._0_8_ = local_208 * dVar13 * 12.0 + local_208 * dVar6 * -48.0;
  local_1a8 = (((dVar16 * dVar13 * 6.0 +
                dVar6 * dVar6 * 8.0 + dVar16 * dVar16 * 3.0 + dVar13 * dVar13 * 3.0) -
               dVar6 * dVar16 * 24.0) - dVar6 * dVar13 * 24.0) * dVar8 * local_168;
  dStack_1a0 = dStack_240;
  uStack_f0 = in_XMM4_Qb ^ 0x8000000000000000;
  local_f8 = -(dVar8 * local_168) * local_148;
  dVar12 = -(1.0 / dVar12) * mu;
  local_1d8._8_4_ = (int)uStack_210;
  local_1d8._0_8_ = local_218 * local_148 * local_1b8;
  local_1d8._12_4_ = (int)((ulong)uStack_210 >> 0x20);
  dVar10 = pow(local_208,3.0);
  local_150 = (dVar10 * 12.0 + (double)local_1e8._0_8_) * local_1b8 * -0.5;
  local_c8._8_4_ = SUB84(dStack_200,0);
  local_c8._0_8_ = local_208 * local_1a8;
  local_c8._12_4_ = (int)((ulong)dStack_200 >> 0x20);
  uVar5 = local_188._12_4_;
  local_188._8_4_ = local_188._8_4_;
  local_188._0_8_ = local_188._0_8_ * mu;
  local_188._12_4_ = uVar5;
  local_1f8 = dVar16 * local_1c8 * 12.0 + local_1c8 * dVar6 * -48.0;
  dStack_1f0 = dStack_240;
  local_1e8._8_4_ = (int)in_XMM4_Qb;
  local_1e8._0_8_ = dVar8 * dVar13 * (double)local_198._0_8_;
  local_1e8._12_4_ = (int)(in_XMM4_Qb >> 0x20);
  local_108 = -(dVar8 * dVar13);
  uStack_100 = in_XMM4_Qb ^ 0x8000000000000000;
  dVar10 = pow(local_1c8,3.0);
  local_1f8 = (dVar10 * 12.0 + local_1f8) * local_1b8 * -0.5;
  local_d8._8_4_ = SUB84(dStack_1c0,0);
  local_d8._0_8_ = local_1c8 * local_1a8;
  local_d8._12_4_ = (int)((ulong)dStack_1c0 >> 0x20);
  local_e8 = (double)local_198._0_8_ * -dVar8 * dVar6;
  uStack_e0 = local_198._8_8_;
  dVar9 = -dVar8 * dVar6 * local_168 * local_148;
  local_128 = dVar16 * local_218 * 48.0 + dVar13 * local_218 * 48.0;
  dStack_120 = dStack_240;
  local_118 = dVar6 * mu * dVar7 * 3.0 + dVar12;
  uStack_110 = uVar4;
  dVar10 = pow(local_218,3.0);
  dVar15 = Rearth * Rearth * J2 * mu;
  dVar13 = (double)local_1d8._0_8_ * 2.5 +
           (dVar12 - local_138 * dVar15 * (double)local_178._0_8_ * 1.5);
  dVar21 = (double)local_198._0_8_ * dVar15 * (double)local_178._0_8_;
  dVar17 = dVar15 * (double)local_198._0_8_ * local_b8;
  dVar14 = local_208 * dVar21;
  dVar12 = dVar15 * local_138;
  pdVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  lVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  pdVar1[3] = ((double)local_178._0_8_ * dVar15 * dVar16 * (double)local_198._0_8_ * 10.5 +
              dVar8 * dVar16 * (double)local_198._0_8_ * local_218 * 15.0 +
              ((local_228 * mu * dVar7 + dVar13) - dVar15 * dVar16 * local_138 * 3.0)) -
              local_168 * dVar8 * dVar16 * local_148 * local_218 * 22.5;
  dVar19 = local_218 * local_98 * local_208 * 3.0;
  dVar20 = local_218 * local_98 * dStack_200 * 3.0;
  dVar8 = local_218 * dVar12 * local_208;
  dVar18 = local_218 * dVar12 * dStack_200;
  dVar16 = dStack_200 * local_f8 * local_208 * local_218 * 22.5 +
           dStack_200 * dVar14 * 10.5 +
           -(dVar12 * local_208) * dStack_200 * 3.0 +
           local_98 * local_208 * dStack_200 * 3.0 + dVar11 * 15.0;
  pdVar1[4] = dVar16;
  pdVar1[5] = local_208 * dVar17 * local_218 * 10.5 +
              (((double)local_c8._0_8_ * 4.5 + local_150 + dVar19) - dVar8 * 9.0);
  pdVar1[lVar2 + 3] = dVar16;
  (pdVar1 + lVar2 + 3)[1] =
       local_148 * local_168 * local_108 * local_218 * 22.5 +
       (double)local_198._0_8_ * (double)local_178._0_8_ * dStack_240 * dVar15 * 10.5 +
       (double)local_1e8._0_8_ * local_218 * 15.0 +
       local_138 * -(dStack_240 * dVar15) * 3.0 + (double)local_188._0_8_ * dVar7 + dVar13;
  pdVar1[lVar2 + 5] =
       dVar17 * local_1c8 * local_218 * 10.5 +
       (((double)local_d8._0_8_ * 4.5 + dVar20 + local_1f8) - dVar18 * 9.0);
  pdVar1[lVar2 * 2 + 3] =
       dVar14 * local_218 * 10.5 +
       dVar8 * 12.0 +
       dVar9 * local_208 * 22.5 +
       (double)local_a8._0_8_ * local_208 * 2.5 + local_e8 * local_208 * 20.0 + dVar19;
  (pdVar1 + lVar2 * 2 + 3)[1] =
       dVar21 * local_1c8 * local_218 * 10.5 +
       dVar18 * 12.0 +
       dVar9 * dStack_200 * 22.5 +
       (double)local_a8._0_8_ * dStack_200 * 2.5 + local_e8 * dStack_200 * 20.0 + dVar20;
  pdVar1[lVar2 * 2 + 5] =
       dVar6 * dVar15 * (double)local_198._0_8_ * local_b8 * 10.5 +
       local_1a8 * local_218 * 4.5 +
       ((dVar6 * dVar15 * local_138 * 6.0 +
        (dVar10 * -32.0 + local_128) * local_1b8 * 0.5 + local_118) - local_b8 * dVar12 * 1.5);
  local_208 = local_78 * local_208;
  dStack_200 = local_78 * dStack_200;
  dVar12 = dStack_200 + dStack_200 + local_88 + local_88;
  dVar10 = (dStack_80 + dStack_80) - (local_208 + local_208);
  dVar9 = -local_58;
  local_88 = local_88 + dStack_200;
  dStack_80 = dStack_80 - local_208;
  dVar16 = SQRT(local_88 * local_88 + dStack_80 * dStack_80 + local_68 * local_68);
  dVar11 = 1.0 / dVar16;
  dVar7 = dVar16 * dVar9;
  dVar6 = dVar11 * dVar9 * local_88;
  dVar13 = local_88 * local_58 * dStack_80 * dVar11 * local_78;
  pdVar1[3] = dVar13 + pdVar1[3];
  pdVar1[4] = dVar16 * local_58 * local_78 + dStack_80 * dStack_80 * local_58 * dVar11 * local_78 +
              pdVar1[4];
  dVar8 = dVar11 * local_58 * dStack_80;
  pdVar1[5] = local_68 * dVar8 * local_78 + pdVar1[5];
  pdVar1[lVar2 + 3] =
       (dVar7 * local_78 - local_88 * local_88 * local_58 * dVar11 * local_78) + pdVar1[lVar2 + 3];
  pdVar1[lVar2 + 4] = pdVar1[lVar2 + 4] - dVar13;
  dVar13 = local_88 * local_58 * dVar11;
  pdVar1[lVar2 + 5] = local_68 * dVar6 * local_78 + pdVar1[lVar2 + 5];
  pdVar1[lVar2 * 3 + 3] = dVar12 * dVar13 * -0.5 + dVar7 + pdVar1[lVar2 * 3 + 3];
  dVar16 = (pdVar1 + lVar2 * 3 + 4)[1];
  pdVar1[lVar2 * 3 + 4] = dVar12 * dVar8 * -0.5 + pdVar1[lVar2 * 3 + 4];
  (pdVar1 + lVar2 * 3 + 4)[1] = local_68 * dVar12 * local_58 * dVar11 * -0.5 + dVar16;
  pdVar1[lVar2 * 4 + 3] = dVar13 * dVar10 * -0.5 + pdVar1[lVar2 * 4 + 3];
  pdVar1[lVar2 * 4 + 4] = dVar8 * dVar10 * -0.5 + dVar7 + pdVar1[lVar2 * 4 + 4];
  pdVar1[lVar2 * 4 + 5] = local_58 * dVar11 * dVar10 * local_68 * -0.5 + pdVar1[lVar2 * 4 + 5];
  dVar16 = (pdVar1 + lVar2 * 5 + 3)[1];
  pdVar1[lVar2 * 5 + 3] = local_68 * dVar6 + pdVar1[lVar2 * 5 + 3];
  (pdVar1 + lVar2 * 5 + 3)[1] = local_68 * dVar11 * dVar9 * dStack_80 + dVar16;
  pdVar1[lVar2 * 5 + 5] = (dVar7 - local_68 * local_68 * local_58 * dVar11) + pdVar1[lVar2 * 5 + 5];
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd GetGravJac(Eigen::Vector3d pos, Eigen::Vector3d vel, double Rearth, double wEarth, double mu, double J2, double J3, double drag_coeff){

		//extract locals
		double x = pos[0];
		double y = pos[1];
		double z = pos[2];
		double v_x = vel[0];
		double v_y = vel[1];
		double v_z = vel[2];

		//initialize matrix
		Eigen::MatrixXd jac = Eigen::MatrixXd::Zero(6,6);

		//velocity component
		jac.block(0,3,3,3) = Eigen::Matrix3d::Identity(3,3);

		//vector A which will be reshaped
		double A_vec[9];

		////// Begin auto-generated code from matlab /////////////

		double t3;
		double t5;
		double t7;
		double t9;
		double t11;
		double t14;
		double t47;
		double t23;
		double t25;
		double t26;
		double t27;
		double t29;
		double t24;
		double t28;
		double t30;
		double t31;
		double t32;
		double t35;
		double t36;
		double t40_tmp;
		double t42_tmp_tmp;
		double t42_tmp;
		double b_t42_tmp;
		double t47_tmp_tmp;
		double b_t47_tmp_tmp;
		double t47_tmp;
		double A_vec_tmp;
		double b_A_vec_tmp;
		double c_A_vec_tmp;

		/* CREATEA */
		/*     A_VEC = CREATEA(J2,J3,REARTH,MU,X,Y,Z) */
		/*     This function was generated by the Symbolic Math Toolbox version 8.4. */
		/*     03-Apr-2021 15:18:59 */
		t3 = x * x;
		t5 = y * y;
		t7 = z * z;
		t9 = t3 * 3.0;
		t11 = t5 * 3.0;
		t14 = t7 * 4.0;
		t47 = t3 + t5;
		t23 = t47 + t7;
		t25 = 1.0 / pow(t23, 1.5);
		t26 = 1.0 / pow(t23, 2.5);
		t27 = 1.0 / pow(t23, 3.5);
		t29 = 1.0 / pow(t23, 5.5);
		t24 = t47 + -t14;
		t28 = pow(t25, 3.0);
		t23 = t9 + t11;
		t30 = t23 + -(t7 * 2.0);
		t31 = t23 + -t14;
		t32 = mu * t25;
		t23 = mu * t26;
		t47 = t23 * x;
		t35 = t47 * z * 3.0;
		t36 = t23 * y * z * 3.0;
		t40_tmp = J2 * mu * (Rearth * Rearth);
		t23 = t40_tmp * t24;
		t42_tmp_tmp = J3 * mu;
		t42_tmp = t42_tmp_tmp * t28;
		b_t42_tmp = t42_tmp * t31;
		t14 = t42_tmp_tmp * t29;
		t47_tmp_tmp = t40_tmp * t27;
		t25 = t47_tmp_tmp * x;
		b_t47_tmp_tmp = t23 * t28;
		t47_tmp = b_t47_tmp_tmp * x;
		t47 = (((t47 * y * 3.0 + t42_tmp * x * y * z * 15.0) + -(t25 * y * 3.0)) +
		 t47_tmp * y * 10.5) + -(t14 * t31 * x * y * z * 22.5);
		A_vec_tmp = t40_tmp * t3;
		b_A_vec_tmp = t42_tmp_tmp * t3;
		c_A_vec_tmp = (-t32 + -(t23 * t27 * 1.5)) + b_t42_tmp * z * 2.5;
		A_vec[0] = ((((c_A_vec_tmp + mu * t9 * t26) - A_vec_tmp * t27 * 3.0) +
		       b_A_vec_tmp * t28 * z * 15.0) + A_vec_tmp * t24 * t28 * 10.5) -
		b_A_vec_tmp * t29 * t31 * z * 22.5;
		A_vec[1] = t47;
		A_vec_tmp = t14 * (((((t3 * t3 * 3.0 + t5 * t5 * 3.0) + t7 * t7 * 8.0) + t3 *
		               t5 * 6.0) + -(t3 * t7 * 24.0)) + -(t5 * t7 * 24.0));
		b_A_vec_tmp = t40_tmp * t28 * t30;
		t14 = t25 * z;
		A_vec[2] = (((t35 - t42_tmp * ((t5 * x * 12.0 - t7 * x * 48.0) + pow(x,
		3.0) * 12.0) / 2.0) + A_vec_tmp * x * 4.5) - t14 * 9.0) + b_A_vec_tmp * x *
		z * 10.5;
		A_vec[3] = t47;
		t23 = t40_tmp * t5;
		t47 = t42_tmp_tmp * t5;
		A_vec[4] = ((((c_A_vec_tmp + mu * t11 * t26) - t23 * t27 * 3.0) + t47 * t28 *
		       z * 15.0) + t23 * t24 * t28 * 10.5) - t47 * t29 * t31 * z * 22.5;
		c_A_vec_tmp = t47_tmp_tmp * y * z;
		A_vec[5] = (((t36 - t42_tmp * ((t3 * y * 12.0 - t7 * y * 48.0) + pow(y,
		3.0) * 12.0) / 2.0) + A_vec_tmp * y * 4.5) - c_A_vec_tmp * 9.0) +
		b_A_vec_tmp * y * z * 10.5;
		b_A_vec_tmp = t42_tmp_tmp * t7;
		t23 = b_A_vec_tmp * t28;
		b_A_vec_tmp = b_A_vec_tmp * t29 * t31;
		A_vec[6] = ((((t35 - t23 * x * 20.0) + b_t42_tmp * x * 2.5) - b_A_vec_tmp * x *
		       22.5) + t14 * 12.0) + t47_tmp * z * 10.5;
		A_vec[7] = ((((t36 - t23 * y * 20.0) + b_t42_tmp * y * 2.5) - b_A_vec_tmp * y *
		       22.5) + c_A_vec_tmp * 12.0) + b_t47_tmp_tmp * y * z * 10.5;
		b_A_vec_tmp = t40_tmp * t7;
		A_vec[8] = (((((-t32 + mu * t7 * t26 * 3.0) + t42_tmp * ((t3 * z * 48.0 + t5 *
		z * 48.0) - pow(z, 3.0) * 32.0) / 2.0) + b_A_vec_tmp * t27 * 6.0) -
		       t47_tmp_tmp * t30 * 1.5) + A_vec_tmp * z * 4.5) + b_A_vec_tmp *
		t28 * t30 * 10.5;


		///////////////// end matlab code /////////////////////

		//reshape A
		jac(3,0) = A_vec[0];
		jac(4,0) = A_vec[1];
		jac(5,0) = A_vec[2];
		jac(3,1) = A_vec[3];
		jac(4,1) = A_vec[4];
		jac(5,1) = A_vec[5];
		jac(3,2) = A_vec[6];
		jac(4,2) = A_vec[7];
		jac(5,2) = A_vec[8];



		/////////// begin matlab drag code /////////

		t5 = wEarth*x;
		double t2 = -t5+v_y;
		t3 = wEarth*y;
		double t4 = t3+v_x;
		double t6 = pow(t2,2.0);
		t7 = pow(t4,2.0);
		double t8 = pow(v_z,2.0);
		t9 = t6+t7+t8;
		double t10 = 1.0/sqrt(t9);
		t11 = sqrt(t9);
		double t12 = drag_coeff*t2*t4*t10*wEarth;
		double t13 = v_x*2.0;
		t14 = wEarth*y*2.0;
		double t15 = t13+t14;
		double t16 = v_y*2.0;
		double t18 = wEarth*x*2.0;
		double t17 = t16-t18;
		jac(3,0) += t12;
		jac(4,0) += drag_coeff*t11*wEarth+drag_coeff*t6*t10*wEarth;
		jac(5,0) += drag_coeff*t2*t10*v_z*wEarth;
		jac(3,1) += -drag_coeff*t11*wEarth-drag_coeff*t7*t10*wEarth;
		jac(4,1) += -t12;
		jac(5,1) += -drag_coeff*t4*t10*v_z*wEarth;
		jac(3,3) += -drag_coeff*t11-drag_coeff*t4*t10*t15*(1.0/2.0);
		jac(4,3) += drag_coeff*t2*t10*t15*(-1.0/2.0);
		jac(5,3) += drag_coeff*t10*t15*v_z*(-1.0/2.0);
		jac(3,4) += drag_coeff*t4*t10*t17*(-1.0/2.0);
		jac(4,4) += -drag_coeff*t11-drag_coeff*t2*t10*t17*(1.0/2.0);
		jac(5,4) += drag_coeff*t10*t17*v_z*(-1.0/2.0);
		jac(3,5) += -drag_coeff*t4*t10*v_z;
		jac(4,5) += -drag_coeff*t2*t10*v_z;
		jac(5,5) += -drag_coeff*t11-drag_coeff*t8*t10;


		////////////////////// end matlab drag code ////////////////


		//return
		return jac;

	}